

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpgen.cpp
# Opt level: O3

Vector2 __thiscall cp::cpgen::calcEndCP(cpgen *this,Pose *ref_land_pose)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  ActualDstType actualDst;
  long in_RDX;
  Vector2 *end_cp;
  long lVar4;
  double in_XMM1_Qa;
  Vector2 VVar5;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  uVar2 = *(uint *)&ref_land_pose[10].field_0x18;
  iVar3 = *(int *)&ref_land_pose[10].field_0x1c;
  lVar4 = (ulong)uVar2 * 0xe0;
  *(double *)this =
       *(double *)(in_RDX + lVar4) +
       ref_land_pose[10].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
       m_storage.m_data.array[0];
  if (iVar3 - 3U < 2) {
    dVar1 = (*(double *)(in_RDX + 8) + *(double *)(in_RDX + 0xe8)) * 0.5;
  }
  else {
    dVar1 = ref_land_pose[10].qq.m_coeffs.
            super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1];
    if (uVar2 == 0) {
      dVar1 = dVar1 + *(double *)(in_RDX + 8);
    }
    else {
      in_XMM1_Qa = *(double *)(in_RDX + lVar4 + 8) - dVar1;
      dVar1 = in_XMM1_Qa;
    }
  }
  *(double *)(this + 8) = dVar1;
  VVar5.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
       in_XMM1_Qa;
  VVar5.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
       dVar1;
  return (Vector2)VVar5.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                  m_data.array;
}

Assistant:

Vector2 cpgen::calcEndCP(const Pose ref_land_pose[]) {

  Vector2 end_cp = Vector2::Zero();
  if (wstate == stopping2 || wstate == stopping1) {
    end_cp.x() = ref_land_pose[swingleg].p().x() + end_cp_offset[0];
    end_cp.y() = (ref_land_pose[0].p().y() + ref_land_pose[1].p().y()) * 0.5;
  } else {
    end_cp.x() = ref_land_pose[swingleg].p().x() + end_cp_offset[0];
    if (swingleg == right) {
      end_cp.y() = ref_land_pose[swingleg].p().y() + end_cp_offset[1];
    } else {
      end_cp.y() = ref_land_pose[swingleg].p().y() - end_cp_offset[1];
    }
  }
  return end_cp;
}